

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

int __thiscall
google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(CodedInputStream *this)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  size_t offset;
  long lVar4;
  byte *pbVar5;
  byte *extraout_RDX;
  ulong uVar6;
  long lVar7;
  pair<unsigned_long,_bool> pVar8;
  
  pbVar5 = this->buffer_;
  pbVar3 = this->buffer_end_;
  if (((int)pbVar3 - (int)pbVar5 < 10) && ((pbVar3 <= pbVar5 || ((char)pbVar3[-1] < '\0')))) {
    pVar8 = ReadVarint64Fallback(this);
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      return -1;
    }
    return -(uint)(pVar8.first >> 0x1f != 0) | (uint)pVar8.first;
  }
  bVar1 = *pbVar5;
  if ((char)bVar1 < '\0') {
    bVar2 = pbVar5[1];
    if (-1 < (long)(char)bVar2) {
      uVar6 = ((long)(char)bVar2 * 0x80 + (ulong)bVar1) - 0x80;
      pbVar5 = pbVar5 + 2;
      goto LAB_002d30ca;
    }
    if (-1 < (long)(char)pbVar5[2]) {
      uVar6 = ((ulong)bVar1 + (ulong)bVar2 * 0x80 + (long)(char)pbVar5[2] * 0x4000) - 0x4080;
      pbVar5 = pbVar5 + 3;
      goto LAB_002d30ca;
    }
    if ((long)(char)pbVar5[3] < 0) {
      if ((long)(char)pbVar5[4] < 0) {
        if ((long)(char)pbVar5[5] < 0) {
          if ((long)(char)pbVar5[6] < 0) {
            if ((long)(char)pbVar5[7] < 0) {
              if ((long)(char)pbVar5[8] < 0) goto LAB_002d3085;
              uVar6 = (long)(char)pbVar5[8] << 0x38;
              lVar4 = 0;
              pbVar3 = pbVar5;
              do {
                uVar6 = uVar6 + ((ulong)*pbVar3 - 0x80 << ((byte)lVar4 & 0x3f));
                lVar4 = lVar4 + 7;
                pbVar3 = pbVar3 + 1;
                lVar7 = 9;
              } while (lVar4 != 0x38);
            }
            else {
              uVar6 = (long)(char)pbVar5[7] << 0x31;
              lVar4 = 0;
              pbVar3 = pbVar5;
              do {
                uVar6 = uVar6 + ((ulong)*pbVar3 - 0x80 << ((byte)lVar4 & 0x3f));
                lVar4 = lVar4 + 7;
                pbVar3 = pbVar3 + 1;
                lVar7 = 8;
              } while (lVar4 != 0x31);
            }
          }
          else {
            uVar6 = (long)(char)pbVar5[6] << 0x2a;
            lVar4 = 0;
            pbVar3 = pbVar5;
            do {
              uVar6 = uVar6 + ((ulong)*pbVar3 - 0x80 << ((byte)lVar4 & 0x3f));
              lVar4 = lVar4 + 7;
              pbVar3 = pbVar3 + 1;
            } while (lVar4 != 0x2a);
            lVar7 = 7;
          }
        }
        else {
          uVar6 = (long)(char)pbVar5[5] << 0x23;
          lVar4 = 0;
          pbVar3 = pbVar5;
          do {
            uVar6 = uVar6 + ((ulong)*pbVar3 - 0x80 << ((byte)lVar4 & 0x3f));
            lVar4 = lVar4 + 7;
            pbVar3 = pbVar3 + 1;
          } while (lVar4 != 0x23);
          lVar7 = 6;
        }
      }
      else {
        uVar6 = (long)(char)pbVar5[4] << 0x1c;
        lVar4 = 0;
        pbVar3 = pbVar5;
        do {
          uVar6 = uVar6 + ((ulong)*pbVar3 - 0x80 << ((byte)lVar4 & 0x3f));
          lVar4 = lVar4 + 7;
          pbVar3 = pbVar3 + 1;
        } while (lVar4 != 0x1c);
        lVar7 = 5;
      }
    }
    else {
      uVar6 = (long)(char)pbVar5[3] << 0x15;
      lVar4 = 0;
      pbVar3 = pbVar5;
      do {
        uVar6 = uVar6 + ((ulong)*pbVar3 - 0x80 << ((byte)lVar4 & 0x3f));
        lVar4 = lVar4 + 7;
        pbVar3 = pbVar3 + 1;
      } while (lVar4 != 0x15);
      lVar7 = 4;
    }
  }
  else {
    this = (CodedInputStream *)(ulong)bVar1;
    ReadVarintSizeAsIntFallback();
    pbVar5 = extraout_RDX;
LAB_002d3085:
    if ((long)(char)pbVar5[9] < 0) {
      return -1;
    }
    uVar6 = (long)(char)pbVar5[9] << 0x3f;
    lVar4 = 0;
    pbVar3 = pbVar5;
    do {
      uVar6 = uVar6 + ((ulong)*pbVar3 - 0x80 << ((byte)lVar4 & 0x3f));
      lVar4 = lVar4 + 7;
      pbVar3 = pbVar3 + 1;
      lVar7 = 10;
    } while (lVar4 != 0x3f);
  }
  if (0x7fffffff < uVar6) {
    return -1;
  }
  pbVar5 = pbVar5 + lVar7;
LAB_002d30ca:
  this->buffer_ = pbVar5;
  return (int)uVar6;
}

Assistant:

int CodedInputStream::ReadVarintSizeAsIntFallback() {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    uint64_t temp;
    ::std::pair<bool, const uint8_t*> p = ReadVarint64FromArray(buffer_, &temp);
    if (!p.first || temp > static_cast<uint64_t>(INT_MAX)) return -1;
    buffer_ = p.second;
    return temp;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    return ReadVarintSizeAsIntSlow();
  }
}